

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<double>::clear(QList<double> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<double> *this_00;
  __off_t __length;
  QArrayDataPointer<double> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<double> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<double> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<double> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<double>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<double>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<double> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<double>::allocatedCapacity(in_RDI);
      QArrayDataPointer<double>::QArrayDataPointer(pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<double>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<double>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<double> *)QArrayDataPointer<double>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<double>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }